

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::SourcePackage::SourcePackage(SourcePackage *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  SourcePackage *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  GenericPackage::GenericPackage(&this->super_GenericPackage,d);
  (this->super_GenericPackage).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__SourcePackage_00339f98;
  Kumu::UUID::UUID(&this->Descriptor);
  if ((this->super_GenericPackage).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericPackage).super_InterchangeObject.m_Dict,
                           MDD_SourcePackage);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_GenericPackage).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x27c,"ASDCP::MXF::SourcePackage::SourcePackage(const Dictionary *)");
}

Assistant:

SourcePackage::SourcePackage(const Dictionary* d) : GenericPackage(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_SourcePackage);
}